

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void err_msg(err_lvl_t lvl,char *path,long ln,char *fmt,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_508 [32];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  char *local_450;
  char *fname;
  va_list ap;
  char local_428 [8];
  char msg [1024];
  char *fmt_local;
  long ln_local;
  char *path_local;
  err_lvl_t lvl_local;
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  if (err_cb != (err_cb_f)0x0) {
    ap[0].overflow_arg_area = local_508;
    ap[0]._0_8_ = &stack0x00000008;
    fname._4_4_ = 0x30;
    fname._0_4_ = 0x20;
    local_4e8 = in_R8;
    local_4e0 = in_R9;
    msg._1016_8_ = fmt;
    vsnprintf(local_428,0x400,fmt,&fname);
    if (path == (char *)0x0) {
      (*err_cb)(err_user_data,lvl,"%s",local_428);
    }
    else {
      local_450 = path2basename(path);
      if (lvl == ERR_INFOCONT) {
        (*err_cb)(err_user_data,ERR_INFOCONT,"%s(%ld): %s",local_450,ln,local_428);
      }
      else if (lvl == ERR_INFO) {
        (*err_cb)(err_user_data,ERR_INFO,"%s: %s(%ld): %s",err_msg::err_prefix[1],local_450,ln,
                  local_428);
      }
      else {
        (*err_cb)(err_user_data,lvl,"%s: \"%s\", line %ld: %s",err_msg::err_prefix[lvl],local_450,ln
                  ,local_428);
      }
    }
  }
  return;
}

Assistant:

void
err_msg(err_lvl_t lvl, const char *path, long ln, const char *fmt, ...)
{
    static const char *err_prefix[ERR_MAX] = {
        "DEBUG", "INFO", "INFOCONT", "WARN", "ERROR", "FATAL"
    };

    char msg[1024];
    va_list ap;

    if (!err_cb)
        return;

    va_start(ap, fmt);
    vsnprintf(msg, sizeof(msg), fmt, ap);
    va_end(ap);

    if (path) {
        const char *fname = path2basename(path);
        if (lvl == ERR_INFOCONT)
    	    err_cb(err_user_data, lvl, "%s(%ld): %s", fname, ln, msg);
        else if (lvl == ERR_INFO)
            err_cb(err_user_data, lvl, "%s: %s(%ld): %s", err_prefix[lvl], fname, ln, msg);
        else
    	    err_cb(err_user_data, lvl, "%s: \"%s\", line %ld: %s", err_prefix[lvl], fname, ln, msg);
    } else {
        err_cb(err_user_data, lvl, "%s", msg);
    }
}